

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.cpp
# Opt level: O2

void __thiscall FSChaCha20Poly1305::NextPacket(FSChaCha20Poly1305 *this)

{
  long lVar1;
  uint32_t uVar2;
  long in_FS_OFFSET;
  Nonce96 nonce;
  Span<const_std::byte> key;
  Span<std::byte> keystream;
  byte one_block [64];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = this->m_packet_counter + 1;
  this->m_packet_counter = uVar2;
  if (uVar2 == this->m_rekey_interval) {
    nonce.second = this->m_rekey_counter;
    nonce._0_8_ = 0xffffffffffffffff;
    keystream.m_size = 0x40;
    keystream.m_data = one_block;
    AEADChaCha20Poly1305::Keystream(&this->m_aead,nonce,keystream);
    key.m_size = 0x20;
    key.m_data = one_block;
    AEADChaCha20Poly1305::SetKey(&this->m_aead,key);
    memory_cleanse(one_block,0x40);
    this->m_packet_counter = 0;
    this->m_rekey_counter = this->m_rekey_counter + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FSChaCha20Poly1305::NextPacket() noexcept
{
    if (++m_packet_counter == m_rekey_interval) {
        // Generate a full block of keystream, to avoid needing the ChaCha20 buffer, even though
        // we only need KEYLEN (32) bytes.
        std::byte one_block[ChaCha20Aligned::BLOCKLEN];
        m_aead.Keystream({0xFFFFFFFF, m_rekey_counter}, one_block);
        // Switch keys.
        m_aead.SetKey(Span{one_block}.first(KEYLEN));
        // Wipe the generated keystream (a copy remains inside m_aead, which will be cleaned up
        // once it cycles again, or is destroyed).
        memory_cleanse(one_block, sizeof(one_block));
        // Update counters.
        m_packet_counter = 0;
        ++m_rekey_counter;
    }
}